

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O2

void cmn_live(cmn_t *cmn,mfcc_t **incep,int32 varnorm,int32 nfr)

{
  int iVar1;
  float *pfVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (0 < nfr) {
    if (varnorm != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
              ,0x79,"Variance normalization not implemented in live mode decode\n");
      exit(1);
    }
    for (uVar5 = 0; uVar5 != (uint)nfr; uVar5 = uVar5 + 1) {
      pfVar2 = (float *)incep[uVar5];
      if (0.0 < *pfVar2 || *pfVar2 == 0.0) {
        uVar3 = cmn->veclen;
        if (cmn->veclen < 1) {
          uVar3 = 0;
        }
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          cmn->sum[uVar6] = (mfcc_t)(pfVar2[uVar6] + (float)cmn->sum[uVar6]);
          pfVar2[uVar6] = pfVar2[uVar6] - (float)cmn->cmn_mean[uVar6];
        }
        cmn->nframe = cmn->nframe + 1;
      }
    }
    if (800 < cmn->nframe) {
      uVar6 = 0;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
              ,0x47,"Update from < %s >\n",cmn->repr);
      iVar1 = cmn->nframe;
      uVar5 = (ulong)(uint)cmn->veclen;
      if (cmn->veclen < 1) {
        uVar5 = uVar6;
      }
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        cmn->cmn_mean[uVar6] = (mfcc_t)((float)cmn->sum[uVar6] / (float)iVar1);
      }
      if (799 < iVar1) {
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          cmn->sum[uVar6] = (mfcc_t)((float)cmn->sum[uVar6] * (1.0 / (float)iVar1) * 500.0);
        }
        cmn->nframe = 500;
      }
      pcVar4 = cmn_update_repr(cmn);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
              ,0x53,"Update to   < %s >\n",pcVar4);
      return;
    }
  }
  return;
}

Assistant:

void
cmn_live(cmn_t *cmn, mfcc_t **incep, int32 varnorm, int32 nfr)
{
    int32 i, j;

    if (nfr <= 0)
        return;

    if (varnorm)
        E_FATAL
            ("Variance normalization not implemented in live mode decode\n");

    for (i = 0; i < nfr; i++) {

	/* Skip zero energy frames */
	if (incep[i][0] < 0)
	    continue;

        for (j = 0; j < cmn->veclen; j++) {
            cmn->sum[j] += incep[i][j];
            incep[i][j] -= cmn->cmn_mean[j];
        }

        ++cmn->nframe;
    }

    /* Shift buffer down if we have more than CMN_WIN_HWM frames */
    if (cmn->nframe > CMN_WIN_HWM)
        cmn_live_shiftwin(cmn);
}